

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_req.cxx
# Opt level: O1

ptr<snapshot_sync_req> __thiscall
nuraft::snapshot_sync_req::deserialize(snapshot_sync_req *this,buffer_serializer *bs)

{
  ulong uVar1;
  uint8_t uVar2;
  uint64_t offset;
  void *__src;
  size_t sVar3;
  byte *__dest;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  ptr<snapshot_sync_req> pVar6;
  ptr<snapshot> snp;
  buffer *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  ptr<buffer> local_58;
  ptr<snapshot> local_40;
  
  snapshot::deserialize((snapshot *)&local_40,bs);
  offset = buffer_serializer::get_u64(bs);
  uVar2 = buffer_serializer::get_u8(bs);
  __src = buffer_serializer::data(bs);
  local_58.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_58.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar1 = bs->pos_;
  sVar3 = buffer_serializer::size(bs);
  if (uVar1 < sVar3) {
    sVar3 = buffer_serializer::size(bs);
    sVar3 = sVar3 - bs->pos_;
    buffer::alloc((buffer *)&local_68,sVar3);
    _Var5._M_pi = local_58.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    local_58.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Stack_60;
    local_58.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_68;
    local_68 = (buffer *)0x0;
    p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (_Var5._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi);
    }
    if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
    }
    __dest = buffer::data(local_58.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
    memcpy(__dest,__src,sVar3);
  }
  else {
    buffer::alloc((buffer *)&local_68,0);
    _Var5._M_pi = local_58.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    local_58.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Stack_60;
    local_58.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_68;
    local_68 = (buffer *)0x0;
    p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (_Var5._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi);
    }
    if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
    }
  }
  (this->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
  p_Var4->_M_use_count = 1;
  p_Var4->_M_weak_count = 1;
  p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00164090;
  snapshot_sync_req((snapshot_sync_req *)(p_Var4 + 1),&local_40,offset,&local_58,uVar2 == '\x01');
  (this->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var4;
  (this->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var4 + 1);
  _Var5._M_pi = extraout_RDX;
  if (local_58.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var5._M_pi = extraout_RDX_00;
  }
  if (local_40.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var5._M_pi = extraout_RDX_01;
  }
  pVar6.super___shared_ptr<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var5._M_pi;
  pVar6.super___shared_ptr<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (ptr<snapshot_sync_req>)
         pVar6.super___shared_ptr<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<snapshot_sync_req> snapshot_sync_req::deserialize(buffer_serializer& bs) {
    ptr<snapshot> snp(snapshot::deserialize(bs));
    ulong offset = bs.get_u64();
    bool done = bs.get_u8() == 1;
    byte* src = (byte*)bs.data();
    ptr<buffer> b;
    if (bs.pos() < bs.size()) {
        size_t sz = bs.size() - bs.pos();
        b = buffer::alloc(sz);
        ::memcpy(b->data(), src, sz);
    }
    else {
        b = buffer::alloc(0);
    }

    return cs_new<snapshot_sync_req>(snp, offset, b, done);
}